

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,char *type,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  layer_destroyer_func in_RCX;
  layer_creator_func in_RDX;
  char *in_RSI;
  long *in_RDI;
  void *in_R8;
  custom_layer_registry_entry entry_1;
  int custom_index;
  overwrite_builtin_layer_registry_entry entry;
  size_t i;
  int typeindex;
  char *in_stack_ffffffffffffff28;
  value_type *in_stack_ffffffffffffff38;
  vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
  *in_stack_ffffffffffffff40;
  ulong local_40;
  
  uVar1 = layer_to_index(in_stack_ffffffffffffff28);
  if (uVar1 == 0xffffffff) {
    iVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI);
    if (iVar2 == -1) {
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    else {
      fprintf(_stderr,"overwrite existing custom layer type %s",in_RSI);
      fprintf(_stderr,"\n");
      pvVar5 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(in_RDI[9] + 0x98),(long)iVar2);
      pvVar5->name = in_RSI;
      pvVar5 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(in_RDI[9] + 0x98),(long)iVar2);
      pvVar5->creator = in_RDX;
      pvVar5 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(in_RDI[9] + 0x98),(long)iVar2);
      pvVar5->destroyer = in_RCX;
      pvVar5 = std::
               vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                             *)(in_RDI[9] + 0x98),(long)iVar2);
      pvVar5->userdata = in_R8;
    }
  }
  else {
    fprintf(_stderr,"overwrite built-in layer type %s",in_RSI);
    fprintf(_stderr,"\n");
    for (local_40 = 0;
        sVar3 = std::
                vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                ::size((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                        *)(in_RDI[9] + 0xb0)), local_40 < sVar3; local_40 = local_40 + 1) {
      pvVar4 = std::
               vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
               ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                             *)(in_RDI[9] + 0xb0),local_40);
      if (pvVar4->typeindex == uVar1) {
        fprintf(_stderr,"overwrite existing overwritten built-in layer index %d",(ulong)uVar1);
        fprintf(_stderr,"\n");
        pvVar4 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(in_RDI[9] + 0xb0),local_40);
        pvVar4->creator = in_RDX;
        pvVar4 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(in_RDI[9] + 0xb0),local_40);
        pvVar4->destroyer = in_RCX;
        pvVar4 = std::
                 vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ::operator[]((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                               *)(in_RDI[9] + 0xb0),local_40);
        pvVar4->userdata = in_R8;
        return 0;
      }
    }
    std::
    vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
    ::push_back((vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 *)in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
  }
  return 0;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        NCNN_LOGE("overwrite built-in layer type %s", type);

        for (size_t i = 0; i < d->overwrite_builtin_layer_registry.size(); i++)
        {
            if (d->overwrite_builtin_layer_registry[i].typeindex == typeindex)
            {
                NCNN_LOGE("overwrite existing overwritten built-in layer index %d", typeindex);

                d->overwrite_builtin_layer_registry[i].creator = creator;
                d->overwrite_builtin_layer_registry[i].destroyer = destroyer;
                d->overwrite_builtin_layer_registry[i].userdata = userdata;
                return 0;
            }
        }

        struct overwrite_builtin_layer_registry_entry entry = {typeindex, creator, destroyer, userdata};
        d->overwrite_builtin_layer_registry.push_back(entry);
        return 0;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct custom_layer_registry_entry entry = {type, creator, destroyer, userdata};
        d->custom_layer_registry.push_back(entry);
    }
    else
    {
        NCNN_LOGE("overwrite existing custom layer type %s", type);
        d->custom_layer_registry[custom_index].name = type;
        d->custom_layer_registry[custom_index].creator = creator;
        d->custom_layer_registry[custom_index].destroyer = destroyer;
        d->custom_layer_registry[custom_index].userdata = userdata;
    }

    return 0;
}